

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::StringTrieBuilder::FinalValueNode::operator==(FinalValueNode *this,Node *other)

{
  UBool UVar1;
  bool bVar2;
  
  if (this != (FinalValueNode *)other) {
    UVar1 = Node::operator==(&this->super_Node,other);
    if (UVar1 == '\0') {
      bVar2 = false;
    }
    else {
      bVar2 = this->value == *(int *)&other[1].super_UObject._vptr_UObject;
    }
    return bVar2;
  }
  return '\x01';
}

Assistant:

UBool
StringTrieBuilder::FinalValueNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const FinalValueNode &o=(const FinalValueNode &)other;
    return value==o.value;
}